

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O2

int ASN1_BIT_STRING_get_bit(ASN1_BIT_STRING *a,int n)

{
  uint uVar1;
  
  uVar1 = 0;
  if (((a != (ASN1_BIT_STRING *)0x0) && (uVar1 = 0, n / 8 < a->length)) && (a->data != (uchar *)0x0)
     ) {
    uVar1 = (uint)((a->data[n / 8] >> (~n & 7U) & 1) != 0);
  }
  return uVar1;
}

Assistant:

int ASN1_BIT_STRING_get_bit(const ASN1_BIT_STRING *a, int n) {
  int w, v;

  w = n / 8;
  v = 1 << (7 - (n & 0x07));
  if ((a == NULL) || (a->length < (w + 1)) || (a->data == NULL)) {
    return 0;
  }
  return ((a->data[w] & v) != 0);
}